

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

int Ivy_ObjIsMuxType(Ivy_Obj_t *pNode)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  if (((ulong)pNode & 1) == 0) {
    uVar3 = 0;
    if (((((*(uint *)&pNode->field_0x8 & 0xf) == 5) && (((ulong)pNode->pFanin0 & 1) != 0)) &&
        (((ulong)pNode->pFanin1 & 1) != 0)) &&
       ((uVar4 = (ulong)pNode->pFanin0 & 0xfffffffffffffffe, (*(uint *)(uVar4 + 8) & 0xf) == 5 &&
        (uVar5 = (ulong)pNode->pFanin1 & 0xfffffffffffffffe, (*(uint *)(uVar5 + 8) & 0xf) == 5)))) {
      uVar1 = *(ulong *)(uVar4 + 0x10);
      iVar6 = 0;
      iVar7 = 0;
      if (uVar1 != 0) {
        iVar7 = *(int *)(uVar1 & 0xfffffffffffffffe);
      }
      uVar2 = *(ulong *)(uVar5 + 0x10);
      if (uVar2 != 0) {
        iVar6 = *(int *)(uVar2 & 0xfffffffffffffffe);
      }
      uVar3 = 1;
      if ((iVar7 != iVar6) || ((((uint)uVar2 ^ (uint)uVar1) & 1) == 0)) {
        iVar6 = 0;
        iVar7 = 0;
        if (uVar1 != 0) {
          iVar7 = *(int *)(uVar1 & 0xfffffffffffffffe);
        }
        uVar5 = *(ulong *)(uVar5 + 0x18);
        if (uVar5 != 0) {
          iVar6 = *(int *)(uVar5 & 0xfffffffffffffffe);
        }
        if ((iVar7 != iVar6) || ((((uint)uVar1 ^ (uint)uVar5) & 1) == 0)) {
          uVar4 = *(ulong *)(uVar4 + 0x18);
          iVar6 = 0;
          iVar7 = 0;
          if (uVar4 != 0) {
            iVar7 = *(int *)(uVar4 & 0xfffffffffffffffe);
          }
          if (uVar2 != 0) {
            iVar6 = *(int *)(uVar2 & 0xfffffffffffffffe);
          }
          if ((iVar7 != iVar6) || ((((uint)uVar2 ^ (uint)uVar4) & 1) == 0)) {
            iVar6 = 0;
            iVar7 = 0;
            if (uVar4 != 0) {
              iVar7 = *(int *)(uVar4 & 0xfffffffffffffffe);
            }
            if (uVar5 != 0) {
              iVar6 = *(int *)(uVar5 & 0xfffffffffffffffe);
            }
            uVar3 = 0;
            if (iVar7 == iVar6) {
              uVar3 = ((uint)uVar4 ^ (uint)uVar5) & 1;
            }
          }
        }
      }
    }
    return uVar3;
  }
  __assert_fail("!Ivy_IsComplement(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyUtil.c"
                ,0x1e3,"int Ivy_ObjIsMuxType(Ivy_Obj_t *)");
}

Assistant:

int Ivy_ObjIsMuxType( Ivy_Obj_t * pNode )
{
    Ivy_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Ivy_IsComplement(pNode) );
    // if the node is not AND, this is not MUX
    if ( !Ivy_ObjIsAnd(pNode) )
        return 0;
    // if the children are not complemented, this is not MUX
    if ( !Ivy_ObjFaninC0(pNode) || !Ivy_ObjFaninC1(pNode) )
        return 0;
    // get children
    pNode0 = Ivy_ObjFanin0(pNode);
    pNode1 = Ivy_ObjFanin1(pNode);
    // if the children are not ANDs, this is not MUX
    if ( !Ivy_ObjIsAnd(pNode0) || !Ivy_ObjIsAnd(pNode1) )
        return 0;
    // otherwise the node is MUX iff it has a pair of equal grandchildren
    return (Ivy_ObjFaninId0(pNode0) == Ivy_ObjFaninId0(pNode1) && (Ivy_ObjFaninC0(pNode0) ^ Ivy_ObjFaninC0(pNode1))) || 
           (Ivy_ObjFaninId0(pNode0) == Ivy_ObjFaninId1(pNode1) && (Ivy_ObjFaninC0(pNode0) ^ Ivy_ObjFaninC1(pNode1))) ||
           (Ivy_ObjFaninId1(pNode0) == Ivy_ObjFaninId0(pNode1) && (Ivy_ObjFaninC1(pNode0) ^ Ivy_ObjFaninC0(pNode1))) ||
           (Ivy_ObjFaninId1(pNode0) == Ivy_ObjFaninId1(pNode1) && (Ivy_ObjFaninC1(pNode0) ^ Ivy_ObjFaninC1(pNode1)));
}